

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zello_log.h
# Opt level: O1

string * to_string_abi_cxx11_(string *__return_storage_ptr__,ze_result_t result)

{
  long lVar1;
  uint uVar2;
  long *plVar3;
  uint uVar4;
  size_type *psVar5;
  char *pcVar6;
  ulong uVar7;
  ze_result_t __val;
  char *pcVar8;
  uint __len;
  long *local_50 [2];
  long local_40 [2];
  
  if ((int)result < 0x70010001) {
    if ((int)result < 0x70000001) {
      if (result == ZE_RESULT_SUCCESS) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar8 = "ZE_RESULT_SUCCESS";
        pcVar6 = "";
      }
      else {
        if (result != ZE_RESULT_NOT_READY) goto switchD_00107194_caseD_78000018;
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar8 = "ZE_RESULT_NOT_READY";
        pcVar6 = "";
      }
    }
    else {
      switch(result) {
      case ZE_RESULT_ERROR_DEVICE_LOST:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar8 = "ZE_RESULT_ERROR_DEVICE_LOST";
        pcVar6 = "";
        break;
      case ZE_RESULT_ERROR_OUT_OF_HOST_MEMORY:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar8 = "ZE_RESULT_ERROR_OUT_OF_HOST_MEMORY";
        pcVar6 = "";
        break;
      case ZE_RESULT_ERROR_OUT_OF_DEVICE_MEMORY:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar8 = "ZE_RESULT_ERROR_OUT_OF_DEVICE_MEMORY";
        pcVar6 = "";
        break;
      case ZE_RESULT_ERROR_MODULE_BUILD_FAILURE:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar8 = "ZE_RESULT_ERROR_MODULE_BUILD_FAILURE";
        pcVar6 = "";
        break;
      default:
        if (result != ZE_RESULT_ERROR_INSUFFICIENT_PERMISSIONS)
        goto switchD_00107194_caseD_78000018;
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar8 = "ZE_RESULT_ERROR_INSUFFICIENT_PERMISSIONS";
        pcVar6 = "";
      }
    }
  }
  else {
    switch(result) {
    case ZE_RESULT_ERROR_UNINITIALIZED:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "ZE_RESULT_ERROR_UNINITIALIZED";
      pcVar6 = "";
      break;
    case ZE_RESULT_ERROR_UNSUPPORTED_VERSION:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "ZE_RESULT_ERROR_UNSUPPORTED_VERSION";
      pcVar6 = "";
      break;
    case ZE_RESULT_ERROR_UNSUPPORTED_FEATURE:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "ZE_RESULT_ERROR_UNSUPPORTED_FEATURE";
      pcVar6 = "";
      break;
    case ZE_RESULT_ERROR_INVALID_ARGUMENT:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "ZE_RESULT_ERROR_INVALID_ARGUMENT";
      pcVar6 = "";
      break;
    case ZE_RESULT_ERROR_INVALID_NULL_HANDLE:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "ZE_RESULT_ERROR_INVALID_NULL_HANDLE";
      pcVar6 = "";
      break;
    case ZE_RESULT_ERROR_HANDLE_OBJECT_IN_USE:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "ZE_RESULT_ERROR_HANDLE_OBJECT_IN_USE";
      pcVar6 = "";
      break;
    case ZE_RESULT_ERROR_INVALID_NULL_POINTER:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "ZE_RESULT_ERROR_INVALID_NULL_POINTER";
      pcVar6 = "";
      break;
    case ZE_RESULT_ERROR_INVALID_SIZE:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "ZE_RESULT_ERROR_INVALID_SIZE";
      pcVar6 = "";
      break;
    case ZE_RESULT_ERROR_UNSUPPORTED_SIZE:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "ZE_RESULT_ERROR_UNSUPPORTED_SIZE";
      pcVar6 = "";
      break;
    case ZE_RESULT_ERROR_UNSUPPORTED_ALIGNMENT:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "ZE_RESULT_ERROR_UNSUPPORTED_ALIGNMENT";
      pcVar6 = "";
      break;
    case ZE_RESULT_ERROR_INVALID_SYNCHRONIZATION_OBJECT:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "ZE_RESULT_ERROR_INVALID_SYNCHRONIZATION_OBJECT";
      pcVar6 = "";
      break;
    case ZE_RESULT_ERROR_INVALID_ENUMERATION:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "ZE_RESULT_ERROR_INVALID_ENUMERATION";
      pcVar6 = "";
      break;
    case ZE_RESULT_ERROR_UNSUPPORTED_ENUMERATION:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "ZE_RESULT_ERROR_UNSUPPORTED_ENUMERATION";
      pcVar6 = "";
      break;
    case ZE_RESULT_ERROR_UNSUPPORTED_IMAGE_FORMAT:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "ZE_RESULT_ERROR_UNSUPPORTED_IMAGE_FORMAT";
      pcVar6 = "";
      break;
    case ZE_RESULT_ERROR_INVALID_NATIVE_BINARY:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "ZE_RESULT_ERROR_INVALID_NATIVE_BINARY";
      pcVar6 = "";
      break;
    case ZE_RESULT_ERROR_INVALID_GLOBAL_NAME:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "ZE_RESULT_ERROR_INVALID_GLOBAL_NAME";
      pcVar6 = "";
      break;
    case ZE_RESULT_ERROR_INVALID_KERNEL_NAME:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "ZE_RESULT_ERROR_INVALID_KERNEL_NAME";
      pcVar6 = "";
      break;
    case ZE_RESULT_ERROR_INVALID_FUNCTION_NAME:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "ZE_RESULT_ERROR_INVALID_FUNCTION_NAME";
      pcVar6 = "";
      break;
    case ZE_RESULT_ERROR_INVALID_GROUP_SIZE_DIMENSION:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "ZE_RESULT_ERROR_INVALID_GROUP_SIZE_DIMENSION";
      pcVar6 = "";
      break;
    case ZE_RESULT_ERROR_INVALID_GLOBAL_WIDTH_DIMENSION:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "ZE_RESULT_ERROR_INVALID_GLOBAL_WIDTH_DIMENSION";
      pcVar6 = "";
      break;
    case ZE_RESULT_ERROR_INVALID_KERNEL_ARGUMENT_INDEX:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "ZE_RESULT_ERROR_INVALID_KERNEL_ARGUMENT_INDEX";
      pcVar6 = "";
      break;
    case ZE_RESULT_ERROR_INVALID_KERNEL_ARGUMENT_SIZE:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "ZE_RESULT_ERROR_INVALID_KERNEL_ARGUMENT_SIZE";
      pcVar6 = "";
      break;
    case ZE_RESULT_ERROR_INVALID_KERNEL_ATTRIBUTE_VALUE:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "ZE_RESULT_ERROR_INVALID_KERNEL_ATTRIBUTE_VALUE";
      pcVar6 = "";
      break;
    case ZE_RESULT_ERROR_INVALID_MODULE_UNLINKED:
switchD_00107194_caseD_78000018:
      __val = -result;
      if (0 < (int)result) {
        __val = result;
      }
      __len = 1;
      if (9 < __val) {
        uVar7 = (ulong)__val;
        uVar2 = 4;
        do {
          __len = uVar2;
          uVar4 = (uint)uVar7;
          if (uVar4 < 100) {
            __len = __len - 2;
            goto LAB_001075d7;
          }
          if (uVar4 < 1000) {
            __len = __len - 1;
            goto LAB_001075d7;
          }
          if (uVar4 < 10000) goto LAB_001075d7;
          uVar7 = uVar7 / 10000;
          uVar2 = __len + 4;
        } while (99999 < uVar4);
        __len = __len + 1;
      }
LAB_001075d7:
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct((ulong)local_50,(char)__len - (char)((int)result >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((ulong)(result >> 0x1f) + (long)local_50[0]),__len,__val);
      plVar3 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x10c2d2);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar5 = (size_type *)(plVar3 + 2);
      if ((size_type *)*plVar3 == psVar5) {
        lVar1 = plVar3[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
      }
      __return_storage_ptr__->_M_string_length = plVar3[1];
      *plVar3 = (long)psVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      if (local_50[0] == local_40) {
        return __return_storage_ptr__;
      }
      operator_delete(local_50[0],local_40[0] + 1);
      return __return_storage_ptr__;
    case ZE_RESULT_ERROR_INVALID_COMMAND_LIST_TYPE:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "ZE_RESULT_ERROR_INVALID_COMMAND_LIST_TYPE";
      pcVar6 = "";
      break;
    case ZE_RESULT_ERROR_OVERLAPPING_REGIONS:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar8 = "ZE_RESULT_ERROR_OVERLAPPING_REGIONS";
      pcVar6 = "";
      break;
    default:
      if (result == ZE_RESULT_ERROR_NOT_AVAILABLE) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar8 = "ZE_RESULT_ERROR_NOT_AVAILABLE";
        pcVar6 = "";
      }
      else {
        if (result != ZE_RESULT_ERROR_UNKNOWN) goto switchD_00107194_caseD_78000018;
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar8 = "ZE_RESULT_ERROR_UNKNOWN";
        pcVar6 = "";
      }
    }
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar8,pcVar6);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const ze_result_t result) {
  if (result == ZE_RESULT_SUCCESS) {
    return "ZE_RESULT_SUCCESS";
  } else if (result == ZE_RESULT_NOT_READY) {
    return "ZE_RESULT_NOT_READY";
  } else if (result == ZE_RESULT_ERROR_UNINITIALIZED) {
    return "ZE_RESULT_ERROR_UNINITIALIZED";
  } else if (result == ZE_RESULT_ERROR_DEVICE_LOST) {
    return "ZE_RESULT_ERROR_DEVICE_LOST";
  } else if (result == ZE_RESULT_ERROR_INVALID_ARGUMENT) {
    return "ZE_RESULT_ERROR_INVALID_ARGUMENT";
  } else if (result == ZE_RESULT_ERROR_OUT_OF_HOST_MEMORY) {
    return "ZE_RESULT_ERROR_OUT_OF_HOST_MEMORY";
  } else if (result == ZE_RESULT_ERROR_OUT_OF_DEVICE_MEMORY) {
    return "ZE_RESULT_ERROR_OUT_OF_DEVICE_MEMORY";
  } else if (result == ZE_RESULT_ERROR_MODULE_BUILD_FAILURE) {
    return "ZE_RESULT_ERROR_MODULE_BUILD_FAILURE";
  } else if (result == ZE_RESULT_ERROR_INSUFFICIENT_PERMISSIONS) {
    return "ZE_RESULT_ERROR_INSUFFICIENT_PERMISSIONS";
  } else if (result == ZE_RESULT_ERROR_NOT_AVAILABLE) {
    return "ZE_RESULT_ERROR_NOT_AVAILABLE";
  } else if (result == ZE_RESULT_ERROR_UNSUPPORTED_VERSION) {
    return "ZE_RESULT_ERROR_UNSUPPORTED_VERSION";
  } else if (result == ZE_RESULT_ERROR_UNSUPPORTED_FEATURE) {
    return "ZE_RESULT_ERROR_UNSUPPORTED_FEATURE";
  } else if (result == ZE_RESULT_ERROR_INVALID_NULL_HANDLE) {
    return "ZE_RESULT_ERROR_INVALID_NULL_HANDLE";
  } else if (result == ZE_RESULT_ERROR_HANDLE_OBJECT_IN_USE) {
    return "ZE_RESULT_ERROR_HANDLE_OBJECT_IN_USE";
  } else if (result == ZE_RESULT_ERROR_INVALID_NULL_POINTER) {
    return "ZE_RESULT_ERROR_INVALID_NULL_POINTER";
  } else if (result == ZE_RESULT_ERROR_INVALID_SIZE) {
    return "ZE_RESULT_ERROR_INVALID_SIZE";
  } else if (result == ZE_RESULT_ERROR_UNSUPPORTED_SIZE) {
    return "ZE_RESULT_ERROR_UNSUPPORTED_SIZE";
  } else if (result == ZE_RESULT_ERROR_UNSUPPORTED_ALIGNMENT) {
    return "ZE_RESULT_ERROR_UNSUPPORTED_ALIGNMENT";
  } else if (result == ZE_RESULT_ERROR_INVALID_SYNCHRONIZATION_OBJECT) {
    return "ZE_RESULT_ERROR_INVALID_SYNCHRONIZATION_OBJECT";
  } else if (result == ZE_RESULT_ERROR_INVALID_ENUMERATION) {
    return "ZE_RESULT_ERROR_INVALID_ENUMERATION";
  } else if (result == ZE_RESULT_ERROR_UNSUPPORTED_ENUMERATION) {
    return "ZE_RESULT_ERROR_UNSUPPORTED_ENUMERATION";
  } else if (result == ZE_RESULT_ERROR_UNSUPPORTED_IMAGE_FORMAT) {
    return "ZE_RESULT_ERROR_UNSUPPORTED_IMAGE_FORMAT";
  } else if (result == ZE_RESULT_ERROR_INVALID_NATIVE_BINARY) {
    return "ZE_RESULT_ERROR_INVALID_NATIVE_BINARY";
  } else if (result == ZE_RESULT_ERROR_INVALID_GLOBAL_NAME) {
    return "ZE_RESULT_ERROR_INVALID_GLOBAL_NAME";
  } else if (result == ZE_RESULT_ERROR_INVALID_KERNEL_NAME) {
    return "ZE_RESULT_ERROR_INVALID_KERNEL_NAME";
  } else if (result == ZE_RESULT_ERROR_INVALID_FUNCTION_NAME) {
    return "ZE_RESULT_ERROR_INVALID_FUNCTION_NAME";
  } else if (result == ZE_RESULT_ERROR_INVALID_GROUP_SIZE_DIMENSION) {
    return "ZE_RESULT_ERROR_INVALID_GROUP_SIZE_DIMENSION";
  } else if (result == ZE_RESULT_ERROR_INVALID_GLOBAL_WIDTH_DIMENSION) {
    return "ZE_RESULT_ERROR_INVALID_GLOBAL_WIDTH_DIMENSION";
  } else if (result == ZE_RESULT_ERROR_INVALID_KERNEL_ARGUMENT_INDEX) {
    return "ZE_RESULT_ERROR_INVALID_KERNEL_ARGUMENT_INDEX";
  } else if (result == ZE_RESULT_ERROR_INVALID_KERNEL_ARGUMENT_SIZE) {
    return "ZE_RESULT_ERROR_INVALID_KERNEL_ARGUMENT_SIZE";
  } else if (result == ZE_RESULT_ERROR_INVALID_KERNEL_ATTRIBUTE_VALUE) {
    return "ZE_RESULT_ERROR_INVALID_KERNEL_ATTRIBUTE_VALUE";
  } else if (result == ZE_RESULT_ERROR_INVALID_COMMAND_LIST_TYPE) {
    return "ZE_RESULT_ERROR_INVALID_COMMAND_LIST_TYPE";
  } else if (result == ZE_RESULT_ERROR_OVERLAPPING_REGIONS) {
    return "ZE_RESULT_ERROR_OVERLAPPING_REGIONS";
  } else if (result == ZE_RESULT_ERROR_UNKNOWN) {
    return "ZE_RESULT_ERROR_UNKNOWN";
  } else {
    return "Unknown ze_result_t value: " +
      std::to_string(static_cast<int>(result));
  }
}